

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O1

void rx__int_assess_comparison
               (rx_context *context,rx__int x1,rx__int x2,rx__op op,char *expr1,char *expr2,
               char *file,int line,rx_severity severity,char *failure_fmt,...)

{
  bool bVar1;
  size_t sVar2;
  rx_status rVar3;
  char *s;
  char *pcVar4;
  char *file_00;
  char *file_01;
  uint line_00;
  bool bVar5;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar6;
  size_t local_40;
  rx_context *local_38;
  
  line_00 = (uint)expr1;
  if (context == (rx_context *)0x0) {
    __assert_fail("context != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x159c,
                  "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  if (x2 == 0) {
    __assert_fail("expr1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x159d,
                  "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  if (_op == 0) {
    __assert_fail("expr2 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x159e,
                  "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  bVar5 = x1 == 0;
  file_01 = (char *)(ulong)bVar5;
  if (bVar5) {
    s = (char *)0x0;
    pcVar4 = (char *)0x0;
    uVar6 = line_00;
    goto LAB_0010345b;
  }
  s = (char *)0x0;
  pcVar4 = (char *)0x0;
  rVar3 = rx__str_initialize(&local_40,(char *)0x0,"`%s` is expected to be %s `%s`",x2,"equal to",
                             _op);
  sVar2 = local_40;
  bVar1 = false;
  if (rVar3 == RX_SUCCESS) {
    local_38 = context;
    s = (char *)malloc(local_40);
    if (s == (char *)0x0) {
      s = (char *)0x0;
      rx__log(RX_LOG_LEVEL_ALL,pcVar4,0x15ca,"failed to allocate the string (%lu bytes)\n",sVar2);
    }
    else {
      pcVar4 = s;
      rVar3 = rx__str_initialize(&local_40,s,"`%s` is expected to be %s `%s`",x2,"equal to",_op);
      if (rVar3 == RX_SUCCESS) {
        bVar1 = true;
        context = local_38;
        goto LAB_00103369;
      }
      free(s);
    }
    bVar1 = false;
    context = local_38;
  }
LAB_00103369:
  uVar6 = line_00;
  if (!bVar1) {
    s = (char *)0x0;
    rx__log(RX_LOG_LEVEL_ALL,pcVar4,0x15d3,
            "failed to create the failure message for the integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/array.c"
            ,(ulong)line_00);
  }
  pcVar4 = (char *)0x0;
  file_00 = (char *)0x0;
  rVar3 = rx__str_initialize(&local_40,(char *)0x0,"%ld %s %ld",x1,"==",0);
  bVar1 = false;
  if (rVar3 == RX_SUCCESS) {
    pcVar4 = (char *)malloc(local_40);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
      rx__log(RX_LOG_LEVEL_ALL,file_00,0x15dd,"failed to allocate the string (%lu bytes)\n",local_40
             );
      line_00 = uVar6;
    }
    else {
      file_00 = pcVar4;
      line_00 = uVar6;
      rVar3 = rx__str_initialize(&local_40,pcVar4,"%ld %s %ld",x1,"==",0);
      if (rVar3 == RX_SUCCESS) {
        bVar1 = true;
        uVar6 = line_00;
        goto LAB_00103432;
      }
      free(pcVar4);
    }
    bVar1 = false;
    uVar6 = line_00;
  }
LAB_00103432:
  if (!bVar1) {
    pcVar4 = (char *)0x0;
    rx__log(RX_LOG_LEVEL_ALL,file_00,0x15e2,
            "failed to create the diagnostic message for the integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/array.c"
            ,(ulong)line_00);
  }
LAB_0010345b:
  rVar3 = rx_handle_test_result
                    (context,(uint)bVar5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/array.c"
                     ,line_00,(rx_severity)s,pcVar4,
                     (char *)CONCAT44(uVar6,in_stack_ffffffffffffffb8));
  if (rVar3 != RX_SUCCESS) {
    rx__log(RX_LOG_LEVEL_ALL,file_01,0x15ed,
            "failed to handle the test result for the integer comparison test located at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/array.c"
            ,(ulong)line_00);
  }
  free(s);
  free(pcVar4);
  if (x1 != 0) {
    longjmp((__jmp_buf_tag *)context,1);
  }
  return;
}

Assistant:

static void
rx__int_assess_comparison(struct rx_context *context,
                          rx__int x1,
                          rx__int x2,
                          enum rx__op op,
                          const char *expr1,
                          const char *expr2,
                          const char *file,
                          int line,
                          enum rx_severity severity,
                          const char *failure_fmt,
                          ...)
{
    int result;
    char *failure_msg;
    char *diagnostic_msg;

    RX_ASSERT(context != NULL);
    RX_ASSERT(expr1 != NULL);
    RX_ASSERT(expr2 != NULL);
    RX_ASSERT(file != NULL);

    switch (op) {
        case RX__OP_EQUAL:
            result = x1 == x2;
            break;
        case RX__OP_NOT_EQUAL:
            result = x1 != x2;
            break;
        case RX__OP_GREATER:
            result = x1 > x2;
            break;
        case RX__OP_LESSER:
            result = x1 < x2;
            break;
        case RX__OP_GREATER_OR_EQUAL:
            result = x1 >= x2;
            break;
        case RX__OP_LESSER_OR_EQUAL:
            result = x1 <= x2;
            break;
        default:
            RX_ASSERT(0);
            result = 0;
            break;
    }

    if (result) {
        failure_msg = NULL;
        diagnostic_msg = NULL;
    } else {
        enum rx_status status;
        const char *op_symbol;

        if (failure_fmt == NULL) {
            const char *op_name;

            rx__op_get_name(&op_name, op);
            RX__STR_CREATE_3(status,
                             failure_msg,
                             "`%s` is expected to be %s `%s`",
                             expr1,
                             op_name,
                             expr2);
        } else {
            RX__STR_CREATE_VA_LIST(status, failure_msg, failure_fmt);
        }

        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the failure message for "
                            "the integer comparison test located at %s:%d\n",
                            file,
                            line);
            failure_msg = NULL;
        }

        rx__op_get_symbol(&op_symbol, op);
        RX__STR_CREATE_3(status,
                         diagnostic_msg,
                         "%ld %s %ld",
                         (long)x1,
                         op_symbol,
                         (long)x2);
        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the diagnostic message for "
                            "the integer comparison test located at %s:%d\n",
                            file,
                            line);
            diagnostic_msg = NULL;
        }
    }

    if (rx_handle_test_result(
            context, result, file, line, severity, failure_msg, diagnostic_msg)
        != RX_SUCCESS) {
        RX__LOG_DEBUG_2("failed to handle the test result for the integer "
                        "comparison test located at %s:%d\n",
                        file,
                        line);
    }

    RX_FREE(failure_msg);
    RX_FREE(diagnostic_msg);

    if (!result && severity == RX_FATAL) {
        rx_abort(context);
    }
}